

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall
args::
ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
::ValueFlag(ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
            *this,Group *group_,string *name_,string *help_,Matcher *matcher_,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *defaultValue_,
           Options options_)

{
  pointer pcVar1;
  
  NamedBase::NamedBase((NamedBase *)this,name_,help_,options_);
  (this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__FlagBase_001227a0;
  Matcher::Matcher(&(this->super_ValueFlagBase).super_FlagBase.matcher,matcher_);
  (this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__ValueFlag_001229d0;
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  pcVar1 = (defaultValue_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->value,pcVar1,pcVar1 + defaultValue_->_M_string_length);
  (this->defaultValue)._M_dataplus._M_p = (pointer)&(this->defaultValue).field_2;
  pcVar1 = (defaultValue_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->defaultValue,pcVar1,pcVar1 + defaultValue_->_M_string_length);
  Group::Add(group_,(Base *)this);
  return;
}

Assistant:

ValueFlag(Group &group_, const std::string &name_, const std::string &help_, Matcher &&matcher_, const T &defaultValue_, Options options_): ValueFlagBase(name_, help_, std::move(matcher_), options_), value(defaultValue_), defaultValue(defaultValue_)
            {
                group_.Add(*this);
            }